

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsInit(ARKodeMem ark_mem)

{
  void *pvVar1;
  int iVar2;
  SUNNonlinearSolver_Type SVar3;
  ARKodeMem in_RDI;
  int retval;
  ARKodeARKStepMem step_mem;
  SUNNonlinearSolver in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode::ARKStep","arkStep_NlsInit",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    pvVar1 = in_RDI->step_mem;
    *(undefined8 *)((long)pvVar1 + 0x188) = 0;
    *(undefined8 *)((long)pvVar1 + 400) = 0;
    if (*(long *)((long)pvVar1 + 0x110) == 0) {
      iVar2 = SUNNonlinSolSetLSetupFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSetupFn)0x117d538);
    }
    else {
      iVar2 = SUNNonlinSolSetLSetupFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSetupFn)0x117d520);
    }
    if (iVar2 == 0) {
      if (*(long *)((long)pvVar1 + 0x118) == 0) {
        iVar2 = SUNNonlinSolSetLSolveFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSolveFn)0x117d5b2);
      }
      else {
        iVar2 = SUNNonlinSolSetLSolveFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSolveFn)0x117d59a);
      }
      if (iVar2 == 0) {
        SVar3 = SUNNonlinSolGetType((SUNNonlinearSolver)0x117d5fe);
        if (SVar3 == SUNNONLINEARSOLVER_ROOTFIND) {
          if (*(int *)((long)pvVar1 + 0x168) == 0) {
            iVar2 = SUNNonlinSolSetSysFn
                              ((SUNNonlinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               (SUNNonlinSolSysFn)in_stack_ffffffffffffffd8);
          }
          else if (*(int *)((long)pvVar1 + 0x168) == 1) {
            iVar2 = SUNNonlinSolSetSysFn
                              ((SUNNonlinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               (SUNNonlinSolSysFn)in_stack_ffffffffffffffd8);
          }
          else {
            if (*(int *)((long)pvVar1 + 0x168) != 2) {
              arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_NlsInit",
                              "Invalid mass matrix type");
              return -0x16;
            }
            iVar2 = SUNNonlinSolSetSysFn
                              ((SUNNonlinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               (SUNNonlinSolSysFn)in_stack_ffffffffffffffd8);
          }
        }
        else {
          SVar3 = SUNNonlinSolGetType((SUNNonlinearSolver)0x117d6cf);
          if (SVar3 != SUNNONLINEARSOLVER_FIXEDPOINT) {
            arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_NlsInit",
                            "Invalid nonlinear solver type");
            return -0x16;
          }
          if (*(int *)((long)pvVar1 + 0x168) == 0) {
            iVar2 = SUNNonlinSolSetSysFn
                              ((SUNNonlinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               (SUNNonlinSolSysFn)in_stack_ffffffffffffffd8);
          }
          else if (*(int *)((long)pvVar1 + 0x168) == 1) {
            iVar2 = SUNNonlinSolSetSysFn
                              ((SUNNonlinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               (SUNNonlinSolSysFn)in_stack_ffffffffffffffd8);
          }
          else {
            if (*(int *)((long)pvVar1 + 0x168) != 2) {
              arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_NlsInit",
                              "Invalid mass matrix type");
              return -0x16;
            }
            iVar2 = SUNNonlinSolSetSysFn
                              ((SUNNonlinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               (SUNNonlinSolSysFn)in_stack_ffffffffffffffd8);
          }
        }
        if (iVar2 == 0) {
          iVar2 = SUNNonlinSolInitialize((SUNNonlinearSolver)(ulong)in_stack_ffffffffffffffe0);
          if (iVar2 == 0) {
            local_4 = 0;
          }
          else {
            arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_NlsInit",
                            "The nonlinear solver\'s init routine failed.");
            local_4 = -0x1d;
          }
        }
        else {
          arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_NlsInit",
                          "Setting nonlinear system function failed");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_NlsInit",
                        "Setting linear solver solve function failed");
        local_4 = -0x1d;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_NlsInit",
                      "Setting the linear solver setup function failed");
      local_4 = -0x1d;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsInit(ARKodeMem ark_mem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_NlsInit", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* reset counters */
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* set the linear solver setup wrapper function */
  if (step_mem->lsetup)
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, arkStep_NlsLSetup);
  else
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Setting the linear solver setup function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (step_mem->lsolve)
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, arkStep_NlsLSolve);
  else
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Setting linear solver solve function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* set the nonlinear residual/fixed-point function, based on solver type */
  if (SUNNonlinSolGetType(step_mem->NLS) == SUNNONLINEARSOLVER_ROOTFIND) {
    if (step_mem->mass_type == MASS_IDENTITY) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsResidual_MassIdent);
    } else if (step_mem->mass_type == MASS_FIXED) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsResidual_MassFixed);
    } else if (step_mem->mass_type == MASS_TIMEDEP) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsResidual_MassTDep);
    } else {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_NlsInit",
                      "Invalid mass matrix type");
      return(ARK_ILL_INPUT);
    }
  } else if (SUNNonlinSolGetType(step_mem->NLS) ==  SUNNONLINEARSOLVER_FIXEDPOINT) {
    if (step_mem->mass_type == MASS_IDENTITY) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsFPFunction_MassIdent);
    } else if (step_mem->mass_type == MASS_FIXED) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsFPFunction_MassFixed);
    } else if (step_mem->mass_type == MASS_TIMEDEP) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsFPFunction_MassTDep);
    } else {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_NlsInit",
                      "Invalid mass matrix type");
      return(ARK_ILL_INPUT);
    }
  } else {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Invalid nonlinear solver type");
    return(ARK_ILL_INPUT);
  }
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Setting nonlinear system function failed");
    return(ARK_ILL_INPUT);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(step_mem->NLS);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit", MSG_NLS_INIT_FAIL);
    return(ARK_NLS_INIT_FAIL);
  }

  return(ARK_SUCCESS);
}